

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_extension.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ExtensionGenerator::~ExtensionGenerator(ExtensionGenerator *this)

{
  Options::~Options(&this->options_);
  std::__cxx11::string::~string((string *)&this->type_traits_);
  return;
}

Assistant:

ExtensionGenerator::~ExtensionGenerator() {}